

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O0

void __thiscall WorkItemScheduler::start(WorkItemScheduler *this)

{
  bool bVar1;
  WorkItemScheduler *local_50;
  code *local_48;
  undefined8 local_40;
  thread local_38;
  reference local_30;
  Worker *w;
  iterator __end1;
  iterator __begin1;
  vector<Worker,_std::allocator<Worker>_> *__range1;
  WorkItemScheduler *this_local;
  
  this->active_ = true;
  __end1 = std::vector<Worker,_std::allocator<Worker>_>::begin(&this->workers_);
  w = (Worker *)std::vector<Worker,_std::allocator<Worker>_>::end(&this->workers_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Worker_*,_std::vector<Worker,_std::allocator<Worker>_>_>
                                *)&w);
    if (!bVar1) break;
    local_30 = __gnu_cxx::__normal_iterator<Worker_*,_std::vector<Worker,_std::allocator<Worker>_>_>
               ::operator*(&__end1);
    Worker::start(local_30);
    __gnu_cxx::__normal_iterator<Worker_*,_std::vector<Worker,_std::allocator<Worker>_>_>::
    operator++(&__end1);
  }
  local_48 = work_dispatch;
  local_40 = 0;
  local_50 = this;
  std::thread::thread<void(WorkItemScheduler::*)(),WorkItemScheduler*,void>
            (&local_38,(type *)&local_48,&local_50);
  std::thread::operator=(&this->dispatcher_thread_,&local_38);
  std::thread::~thread(&local_38);
  return;
}

Assistant:

void WorkItemScheduler::start()
{
    this->active_ = true;

    for (auto& w : this->workers_)
        w.start();

    this->dispatcher_thread_ = std::thread(&WorkItemScheduler::work_dispatch,
                                           this);
}